

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChValueSpecific<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::CallOut
          (ChValueSpecific<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *this,ChArchiveOut *marchive)

{
  pointer pcVar1;
  ChNameValue<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_18;
  
  pcVar1 = (this->super_ChValue)._name._M_dataplus._M_p;
  local_18._value = this->_ptr_to_val;
  local_18._name = "*this->_ptr_to_val";
  if (pcVar1 != (pointer)0x0) {
    local_18._name = pcVar1;
  }
  local_18._flags = '\0';
  ChArchiveOut::out<Eigen::Matrix<double,_1,_1,1,_1,_1>>(marchive,&local_18);
  return;
}

Assistant:

void ChValueSpecific<TClass>::CallOut(ChArchiveOut& marchive) {
          marchive.out(CHNVP(*this->_ptr_to_val,this->_name.c_str()));
}